

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddPolyline<nivalis::point>
          (ImDrawList *this,point *points,int points_count,ImU32 col,bool closed,float thickness)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint in_ECX;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  bool bVar15;
  bool bVar16;
  float in_XMM0_Da;
  float fVar17;
  float fVar18;
  float fVar19;
  uint r2ai;
  uint l2ai;
  uint r1ai;
  uint l1ai;
  uint ebi;
  uint r2i;
  uint l2i;
  uint r1i;
  uint l1i;
  int vtx_next_id;
  bool bevel_r;
  bool bevel_l;
  uint bi;
  int vertex_count;
  float b2ay;
  float b2ax;
  float b1ay;
  float b1ax;
  float b2y;
  float b2x;
  float b1y;
  float b1x;
  int miter_sign;
  float miter_al;
  float miter_sqlen;
  float min_sqlen;
  float miter_l;
  bool bevel;
  float mray;
  float mrax;
  float mlay;
  float mlax;
  float mry;
  float mrx;
  float mly;
  float mlx;
  float miter_l_recip;
  float inv_len_2;
  float d2_2;
  float sqlen2;
  float dy2;
  float dx2;
  point *p2_1;
  int i2_1;
  point *p1_1;
  int i1_1;
  float inv_len_1;
  float d2_1;
  float dy1;
  float dx1;
  float sqlen1;
  uint unused_indices;
  uint unused_vertices;
  uint first_vtx_ptr;
  float half_thickness_aa;
  float half_thickness;
  int idx_count_1;
  int vtx_count_1;
  int max_n_idx;
  int max_n_vtx;
  float inv_len;
  float d2;
  float dy;
  float dx;
  point *p2;
  point *p1;
  int i2;
  int i1;
  ImU32 col_faded;
  int vtx_count;
  int idx_count;
  ImU32 col_trans;
  float AA_SIZE;
  bool antialias;
  int count;
  ImVec2 uv;
  uint local_1c4;
  uint local_1bc;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  float in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  int local_18c;
  float local_188;
  int local_184;
  float local_180;
  int local_17c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_108;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float local_d4;
  float local_d0;
  float local_cc;
  int local_ac;
  float local_a0;
  float local_9c;
  float local_98;
  float local_68;
  float local_64;
  int local_48;
  int local_2c;
  
  bVar5 = in_R8B & 1;
  if (1 < in_EDX) {
    uVar2 = **(undefined8 **)(in_RDI + 0x38);
    local_2c = in_EDX;
    if (bVar5 == 0) {
      local_2c = in_EDX + -1;
    }
    bVar15 = (*(uint *)(in_RDI + 0x30) & 1) != 0;
    uVar6 = in_ECX & 0xffffff;
    if ((!bVar15) || (1.0 < in_XMM0_Da)) {
      PrimReserve((ImDrawList *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
      local_180 = in_XMM0_Da;
      if (bVar15) {
        local_180 = in_XMM0_Da - 1.0;
      }
      local_180 = local_180 * 0.5;
      fVar17 = local_180 + 1.0;
      iVar1 = *(int *)(in_RDI + 0x4c);
      local_98 = 0.0;
      if (bVar5 != 0) {
        local_9c = **(float **)(in_RSI + 8) - **(float **)(in_RSI + (long)(in_EDX + -1) * 0x18 + 8);
        local_a0 = **(float **)(in_RSI + 0x10) -
                   **(float **)(in_RSI + (long)(in_EDX + -1) * 0x18 + 0x10);
        local_98 = local_9c * local_9c + local_a0 * local_a0;
        if (0.0 < local_9c * local_9c + local_a0 * local_a0) {
          fVar18 = ImSqrt(0.0);
          local_9c = (1.0 / fVar18) * local_9c;
          local_a0 = (1.0 / fVar18) * local_a0;
        }
      }
      for (local_ac = 0; local_ac < in_EDX; local_ac = local_ac + 1) {
        lVar9 = in_RSI + (long)local_ac * 0x18;
        if (local_ac + 1 == in_EDX) {
          local_184 = 0;
        }
        else {
          local_184 = local_ac + 1;
        }
        lVar10 = in_RSI + (long)local_184 * 0x18;
        local_cc = **(float **)(lVar9 + 8) - **(float **)(lVar10 + 8);
        local_d0 = **(float **)(lVar9 + 0x10) - **(float **)(lVar10 + 0x10);
        local_d4 = local_cc * local_cc + local_d0 * local_d0;
        if (0.0 < local_cc * local_cc + local_d0 * local_d0) {
          fVar18 = ImSqrt(0.0);
          local_cc = (1.0 / fVar18) * local_cc;
          local_d0 = (1.0 / fVar18) * local_d0;
        }
        if ((bVar5 == 0) && (local_ac == 0)) {
          local_9c = -local_cc;
          local_a0 = -local_d0;
          local_98 = local_d4;
        }
        else if ((bVar5 == 0) && (local_ac == in_EDX + -1)) {
          local_cc = -local_9c;
          local_d0 = -local_a0;
          local_d4 = local_98;
        }
        fVar18 = local_9c * local_d0 + -(local_a0 * local_cc);
        bVar4 = 1e-05 < local_9c * local_cc + local_a0 * local_d0;
        fVar19 = ImFabs(fVar18);
        if (fVar19 <= 1e-05) {
          local_e4 = local_a0 * local_180 + **(float **)(lVar9 + 8);
          local_e8 = -local_9c * local_180 + **(float **)(lVar9 + 0x10);
          local_ec = -local_a0 * local_180 + **(float **)(lVar9 + 8);
          local_f0 = local_9c * local_180 + **(float **)(lVar9 + 0x10);
          if (bVar15) {
            local_f4 = local_a0 * fVar17 + **(float **)(lVar9 + 8);
            local_f8 = -local_9c * fVar17 + **(float **)(lVar9 + 0x10);
            local_fc = -local_a0 * fVar17 + **(float **)(lVar9 + 8);
            local_100 = local_9c * fVar17 + **(float **)(lVar9 + 0x10);
          }
        }
        else {
          local_108 = local_180 / fVar18;
          if (bVar4) {
            if (local_98 <= local_d4) {
              local_188 = local_98;
            }
            else {
              local_188 = local_d4;
            }
            if (local_188 <
                ((local_9c + local_cc) * (local_9c + local_cc) +
                (local_a0 + local_d0) * (local_a0 + local_d0)) * local_108 * local_108) {
              fVar19 = ImSqrt(0.0);
              local_108 = fVar19 * local_108;
            }
          }
          local_e4 = -(local_9c + local_cc) * local_108 + **(float **)(lVar9 + 8);
          local_e8 = -(local_a0 + local_d0) * local_108 + **(float **)(lVar9 + 0x10);
          local_ec = (local_9c + local_cc) * local_108 + **(float **)(lVar9 + 8);
          local_f0 = (local_a0 + local_d0) * local_108 + **(float **)(lVar9 + 0x10);
          if (bVar15) {
            fVar19 = fVar17 / fVar18;
            local_f4 = -(local_9c + local_cc) * fVar19 + **(float **)(lVar9 + 8);
            local_f8 = -(local_a0 + local_d0) * fVar19 + **(float **)(lVar9 + 0x10);
            local_fc = (local_9c + local_cc) * fVar19 + **(float **)(lVar9 + 8);
            local_100 = (local_a0 + local_d0) * fVar19 + **(float **)(lVar9 + 0x10);
          }
        }
        iVar8 = (uint)(0.0 <= fVar18) - (uint)(fVar18 < 0.0);
        if (bVar4) {
          local_11c = (-local_a0 * (float)iVar8 + local_9c) * local_180 + **(float **)(lVar9 + 8);
          local_120 = (local_9c * (float)iVar8 + local_a0) * local_180 + **(float **)(lVar9 + 0x10);
          local_124 = (local_d0 * (float)iVar8 + local_cc) * local_180 + **(float **)(lVar9 + 8);
          local_128 = (-local_cc * (float)iVar8 + local_d0) * local_180 + **(float **)(lVar9 + 0x10)
          ;
          if (bVar15) {
            local_12c = (-local_a0 * (float)iVar8 + local_9c) * fVar17 + **(float **)(lVar9 + 8);
            local_130 = (local_9c * (float)iVar8 + local_a0) * fVar17 + **(float **)(lVar9 + 0x10);
            local_134 = (local_d0 * (float)iVar8 + local_cc) * fVar17 + **(float **)(lVar9 + 8);
            local_138 = (-local_cc * (float)iVar8 + local_d0) * fVar17 + **(float **)(lVar9 + 0x10);
          }
        }
        local_9c = -local_cc;
        local_a0 = -local_d0;
        local_98 = local_d4;
        if (bVar15) {
          local_18c = 4;
          if (bVar4) {
            local_18c = 6;
          }
        }
        else {
          local_18c = 2;
          if (bVar4) {
            local_18c = 3;
          }
        }
        local_1c4 = 2;
        if (bVar15) {
          local_1c4 = 4;
        }
        bVar16 = iVar8 < 0;
        bVar3 = 0 < iVar8;
        if (bVar4 && bVar16) {
          local_194 = local_11c;
        }
        else {
          local_194 = local_e4;
        }
        **(float **)(in_RDI + 0x50) = local_194;
        if (bVar4 && bVar16) {
          local_198 = local_120;
        }
        else {
          local_198 = local_e8;
        }
        *(float *)(*(long *)(in_RDI + 0x50) + 4) = local_198;
        *(undefined8 *)(*(long *)(in_RDI + 0x50) + 8) = uVar2;
        *(uint *)(*(long *)(in_RDI + 0x50) + 0x10) = in_ECX;
        if (bVar4 && bVar3) {
          local_19c = local_11c;
        }
        else {
          local_19c = local_ec;
        }
        *(float *)(*(long *)(in_RDI + 0x50) + 0x14) = local_19c;
        if (bVar4 && bVar3) {
          local_1a0 = local_120;
        }
        else {
          local_1a0 = local_f0;
        }
        *(float *)(*(long *)(in_RDI + 0x50) + 0x18) = local_1a0;
        *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x1c) = uVar2;
        *(uint *)(*(long *)(in_RDI + 0x50) + 0x24) = in_ECX;
        if (bVar4) {
          *(float *)(*(long *)(in_RDI + 0x50) + (ulong)local_1c4 * 0x14) = local_124;
          *(float *)(*(long *)(in_RDI + 0x50) + (ulong)local_1c4 * 0x14 + 4) = local_128;
          *(undefined8 *)(*(long *)(in_RDI + 0x50) + (ulong)local_1c4 * 0x14 + 8) = uVar2;
          *(uint *)(*(long *)(in_RDI + 0x50) + (ulong)local_1c4 * 0x14 + 0x10) = in_ECX;
        }
        if (bVar15) {
          if (bVar4 && bVar16) {
            local_1a4 = local_12c;
          }
          else {
            local_1a4 = local_f4;
          }
          *(float *)(*(long *)(in_RDI + 0x50) + 0x28) = local_1a4;
          if (bVar4 && bVar16) {
            local_1a8 = local_130;
          }
          else {
            local_1a8 = local_f8;
          }
          *(float *)(*(long *)(in_RDI + 0x50) + 0x2c) = local_1a8;
          *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x30) = uVar2;
          *(uint *)(*(long *)(in_RDI + 0x50) + 0x38) = uVar6;
          in_stack_fffffffffffffe54 = local_fc;
          if (bVar4 && bVar3) {
            in_stack_fffffffffffffe54 = local_12c;
          }
          *(float *)(*(long *)(in_RDI + 0x50) + 0x3c) = in_stack_fffffffffffffe54;
          in_stack_fffffffffffffe50 = local_100;
          if (bVar4 && bVar3) {
            in_stack_fffffffffffffe50 = local_130;
          }
          *(float *)(*(long *)(in_RDI + 0x50) + 0x40) = in_stack_fffffffffffffe50;
          *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x44) = uVar2;
          *(uint *)(*(long *)(in_RDI + 0x50) + 0x4c) = uVar6;
          if (bVar4) {
            *(float *)(*(long *)(in_RDI + 0x50) + 100) = local_134;
            *(float *)(*(long *)(in_RDI + 0x50) + 0x68) = local_138;
            *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x6c) = uVar2;
            *(uint *)(*(long *)(in_RDI + 0x50) + 0x74) = uVar6;
          }
        }
        *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + (long)local_18c * 0x14;
        if (local_ac < local_2c) {
          in_stack_fffffffffffffe4c = iVar1;
          if (local_ac < in_EDX + -1) {
            in_stack_fffffffffffffe4c = *(int *)(in_RDI + 0x4c) + local_18c;
          }
          in_stack_fffffffffffffe48 = *(int *)(in_RDI + 0x4c);
          local_1bc = local_1c4;
          if (!bVar4 || !bVar16) {
            local_1bc = 0;
          }
          iVar8 = in_stack_fffffffffffffe48 + local_1bc;
          if (!bVar4 || !bVar3) {
            local_1c4 = 1;
          }
          iVar11 = *(int *)(in_RDI + 0x4c) + local_1c4;
          iVar12 = in_stack_fffffffffffffe4c + 1;
          iVar13 = *(int *)(in_RDI + 0x4c);
          **(int **)(in_RDI + 0x58) = iVar8;
          *(int *)(*(long *)(in_RDI + 0x58) + 4) = iVar11;
          *(int *)(*(long *)(in_RDI + 0x58) + 8) = iVar12;
          *(int *)(*(long *)(in_RDI + 0x58) + 0xc) = iVar8;
          *(int *)(*(long *)(in_RDI + 0x58) + 0x10) = iVar12;
          *(int *)(*(long *)(in_RDI + 0x58) + 0x14) = in_stack_fffffffffffffe4c;
          *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + 0x18;
          if (bVar4) {
            **(int **)(in_RDI + 0x58) = iVar8;
            *(int *)(*(long *)(in_RDI + 0x58) + 4) = iVar11;
            *(uint *)(*(long *)(in_RDI + 0x58) + 8) = iVar13 + (uint)(!bVar4 || !bVar16);
            *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + 0xc;
          }
          if (bVar15) {
            iVar13 = 2;
            if (bVar4 && bVar16) {
              iVar13 = 5;
            }
            iVar13 = *(int *)(in_RDI + 0x4c) + iVar13;
            iVar14 = 3;
            if (bVar4 && bVar3) {
              iVar14 = 5;
            }
            iVar14 = *(int *)(in_RDI + 0x4c) + iVar14;
            **(int **)(in_RDI + 0x58) = iVar13;
            *(int *)(*(long *)(in_RDI + 0x58) + 4) = iVar8;
            *(int *)(*(long *)(in_RDI + 0x58) + 8) = in_stack_fffffffffffffe4c;
            *(int *)(*(long *)(in_RDI + 0x58) + 0xc) = iVar13;
            *(int *)(*(long *)(in_RDI + 0x58) + 0x10) = in_stack_fffffffffffffe4c;
            *(int *)(*(long *)(in_RDI + 0x58) + 0x14) = in_stack_fffffffffffffe4c + 2;
            *(int *)(*(long *)(in_RDI + 0x58) + 0x18) = iVar14;
            *(int *)(*(long *)(in_RDI + 0x58) + 0x1c) = iVar11;
            *(int *)(*(long *)(in_RDI + 0x58) + 0x20) = iVar12;
            *(int *)(*(long *)(in_RDI + 0x58) + 0x24) = iVar14;
            *(int *)(*(long *)(in_RDI + 0x58) + 0x28) = iVar12;
            *(int *)(*(long *)(in_RDI + 0x58) + 0x2c) = in_stack_fffffffffffffe4c + 3;
            *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + 0x30;
            if (bVar4) {
              iVar8 = 2;
              if (bVar4 && bVar3) {
                iVar8 = 1;
              }
              **(int **)(in_RDI + 0x58) = *(int *)(in_RDI + 0x4c) + iVar8;
              iVar8 = 0;
              if (bVar4 && bVar3) {
                iVar8 = 3;
              }
              *(int *)(*(long *)(in_RDI + 0x58) + 4) = *(int *)(in_RDI + 0x4c) + iVar8;
              iVar8 = 4;
              if (bVar4 && bVar3) {
                iVar8 = 5;
              }
              *(int *)(*(long *)(in_RDI + 0x58) + 8) = *(int *)(in_RDI + 0x4c) + iVar8;
              iVar8 = 2;
              if (bVar4 && bVar3) {
                iVar8 = 1;
              }
              *(int *)(*(long *)(in_RDI + 0x58) + 0xc) = *(int *)(in_RDI + 0x4c) + iVar8;
              iVar8 = 4;
              if (bVar4 && bVar3) {
                iVar8 = 5;
              }
              *(int *)(*(long *)(in_RDI + 0x58) + 0x10) = *(int *)(in_RDI + 0x4c) + iVar8;
              iVar8 = 5;
              if (bVar4 && bVar3) {
                iVar8 = 4;
              }
              *(int *)(*(long *)(in_RDI + 0x58) + 0x14) = *(int *)(in_RDI + 0x4c) + iVar8;
              *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + 0x18;
            }
          }
        }
        *(int *)(in_RDI + 0x4c) = local_18c + *(int *)(in_RDI + 0x4c);
      }
      PrimUnreserve((ImDrawList *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
    }
    else {
      PrimReserve((ImDrawList *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
      uVar7 = in_ECX & 0xffffff | (int)((float)(in_ECX >> 0x18) * in_XMM0_Da) << 0x18;
      for (local_48 = 0; local_48 < local_2c; local_48 = local_48 + 1) {
        if (local_48 + 1 == in_EDX) {
          local_17c = 0;
        }
        else {
          local_17c = local_48 + 1;
        }
        lVar9 = in_RSI + (long)local_48 * 0x18;
        lVar10 = in_RSI + (long)local_17c * 0x18;
        local_64 = **(float **)(lVar10 + 8) - **(float **)(lVar9 + 8);
        local_68 = **(float **)(lVar10 + 0x10) - **(float **)(lVar9 + 0x10);
        if (0.0 < local_64 * local_64 + local_68 * local_68) {
          fVar17 = ImSqrt(0.0);
          local_64 = (1.0 / fVar17) * local_64;
          local_68 = (1.0 / fVar17) * local_68;
        }
        local_64 = local_64 * 1.0;
        local_68 = local_68 * 1.0;
        **(float **)(in_RDI + 0x50) = **(float **)(lVar9 + 8) + local_68;
        *(float *)(*(long *)(in_RDI + 0x50) + 4) = **(float **)(lVar9 + 0x10) - local_64;
        *(undefined8 *)(*(long *)(in_RDI + 0x50) + 8) = uVar2;
        *(uint *)(*(long *)(in_RDI + 0x50) + 0x10) = uVar6;
        *(undefined4 *)(*(long *)(in_RDI + 0x50) + 0x14) = **(undefined4 **)(lVar9 + 8);
        *(undefined4 *)(*(long *)(in_RDI + 0x50) + 0x18) = **(undefined4 **)(lVar9 + 0x10);
        *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x1c) = uVar2;
        *(uint *)(*(long *)(in_RDI + 0x50) + 0x24) = uVar7;
        *(float *)(*(long *)(in_RDI + 0x50) + 0x28) = **(float **)(lVar9 + 8) - local_68;
        *(float *)(*(long *)(in_RDI + 0x50) + 0x2c) = **(float **)(lVar9 + 0x10) + local_64;
        *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x30) = uVar2;
        *(uint *)(*(long *)(in_RDI + 0x50) + 0x38) = uVar6;
        *(float *)(*(long *)(in_RDI + 0x50) + 0x3c) = **(float **)(lVar10 + 8) + local_68;
        *(float *)(*(long *)(in_RDI + 0x50) + 0x40) = **(float **)(lVar10 + 0x10) - local_64;
        *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x44) = uVar2;
        *(uint *)(*(long *)(in_RDI + 0x50) + 0x4c) = uVar6;
        *(undefined4 *)(*(long *)(in_RDI + 0x50) + 0x50) = **(undefined4 **)(lVar10 + 8);
        *(undefined4 *)(*(long *)(in_RDI + 0x50) + 0x54) = **(undefined4 **)(lVar10 + 0x10);
        *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x58) = uVar2;
        *(uint *)(*(long *)(in_RDI + 0x50) + 0x60) = uVar7;
        *(float *)(*(long *)(in_RDI + 0x50) + 100) = **(float **)(lVar10 + 8) - local_68;
        *(float *)(*(long *)(in_RDI + 0x50) + 0x68) = **(float **)(lVar10 + 0x10) + local_64;
        *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x6c) = uVar2;
        *(uint *)(*(long *)(in_RDI + 0x50) + 0x74) = uVar6;
        *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 0x78;
        **(undefined4 **)(in_RDI + 0x58) = *(undefined4 *)(in_RDI + 0x4c);
        *(int *)(*(long *)(in_RDI + 0x58) + 4) = *(int *)(in_RDI + 0x4c) + 1;
        *(int *)(*(long *)(in_RDI + 0x58) + 8) = *(int *)(in_RDI + 0x4c) + 4;
        *(undefined4 *)(*(long *)(in_RDI + 0x58) + 0xc) = *(undefined4 *)(in_RDI + 0x4c);
        *(int *)(*(long *)(in_RDI + 0x58) + 0x10) = *(int *)(in_RDI + 0x4c) + 4;
        *(int *)(*(long *)(in_RDI + 0x58) + 0x14) = *(int *)(in_RDI + 0x4c) + 3;
        *(int *)(*(long *)(in_RDI + 0x58) + 0x18) = *(int *)(in_RDI + 0x4c) + 1;
        *(int *)(*(long *)(in_RDI + 0x58) + 0x1c) = *(int *)(in_RDI + 0x4c) + 2;
        *(int *)(*(long *)(in_RDI + 0x58) + 0x20) = *(int *)(in_RDI + 0x4c) + 5;
        *(int *)(*(long *)(in_RDI + 0x58) + 0x24) = *(int *)(in_RDI + 0x4c) + 1;
        *(int *)(*(long *)(in_RDI + 0x58) + 0x28) = *(int *)(in_RDI + 0x4c) + 5;
        *(int *)(*(long *)(in_RDI + 0x58) + 0x2c) = *(int *)(in_RDI + 0x4c) + 4;
        *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + 0x30;
        *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x4c) + 6;
      }
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const Vec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count; // segment count
    if (!closed)
        count = points_count -1 ;

    const bool antialias = Flags & ImDrawListFlags_AntiAliasedLines;
    const float AA_SIZE = 1.0f;
    const ImU32 col_trans = col & ~IM_COL32_A_MASK;

    if (antialias && thickness <= 1.0f)
    {
        // Anti-aliased stroke approximation
        const int idx_count = count*12;
        const int vtx_count = count*6;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);
        const ImU32 col_faded = (col & ~IM_COL32_A_MASK) | ((int)(((col >> IM_COL32_A_SHIFT) & 0xFF) * thickness) << IM_COL32_A_SHIFT);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const Vec2& p1 = points[i1];
            const Vec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= AA_SIZE;
            dy *= AA_SIZE;

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
            _VtxWritePtr[1].pos.x = p1.x     ; _VtxWritePtr[1].pos.y = p1.y     ; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_faded;
            _VtxWritePtr[2].pos.x = p1.x - dy; _VtxWritePtr[2].pos.y = p1.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;

            _VtxWritePtr[3].pos.x = p2.x + dy; _VtxWritePtr[3].pos.y = p2.y - dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
            _VtxWritePtr[4].pos.x = p2.x     ; _VtxWritePtr[4].pos.y = p2.y     ; _VtxWritePtr[4].uv = uv; _VtxWritePtr[4].col = col_faded;
            _VtxWritePtr[5].pos.x = p2.x - dy; _VtxWritePtr[5].pos.y = p2.y + dx; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
            _VtxWritePtr += 6;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+4); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr[6] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[7] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[8] = (ImDrawIdx)(_VtxCurrentIdx+5);
            _IdxWritePtr[9] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[10] = (ImDrawIdx)(_VtxCurrentIdx+5); _IdxWritePtr[11] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr += 12;
            _VtxCurrentIdx += 6;
        }
    }
    else
    {
        // Precise line with bevels on acute angles
        const int max_n_vtx = antialias ? 6 : 3;
        const int max_n_idx = 3 * (antialias ? 9 : 3);
        const int vtx_count = points_count * max_n_vtx;
        const int idx_count = count * max_n_idx;
        PrimReserve(idx_count, vtx_count);

        const float half_thickness = (antialias ? thickness - AA_SIZE : thickness) * 0.5f;
        const float half_thickness_aa = half_thickness + AA_SIZE;
        unsigned int first_vtx_ptr = _VtxCurrentIdx;
        unsigned int unused_vertices = 0;
        unsigned int unused_indices = 0;

        float sqlen1 = 0.0f;
        float dx1, dy1;
        if (closed)
        {
            dx1 = points[0].x - points[points_count-1].x;
            dy1 = points[0].y - points[points_count-1].y;
            sqlen1 = dx1 * dx1 + dy1 * dy1;
            IM_NORMALIZE2F_OVER_ZERO(dx1, dy1);
        }

        for (int i1 = 0; i1 < points_count; i1++)
        {
            const Vec2& p1 = points[i1];
            const int i2 = (i1 + 1 == points_count) ? 0 : i1 + 1;
            const Vec2& p2 = points[i2];
            float dx2 = p1.x - p2.x;
            float dy2 = p1.y - p2.y;
            float sqlen2 = dx2 * dx2 + dy2 * dy2;
            IM_NORMALIZE2F_OVER_ZERO(dx2, dy2);

            if (!closed && i1 == 0)
            {
                dx1 = -dx2;
                dy1 = -dy2;
                sqlen1 = sqlen2;
            }
            else if (!closed && i1 == points_count-1)
            {
                dx2 = -dx1;
                dy2 = -dy1;
                sqlen2 = sqlen1;
            }

            float miter_l_recip = dx1 * dy2 - dy1 * dx2;
            float mlx, mly, mrx, mry;     // Left and right miters
            float mlax, mlay, mrax, mray; // Left and right miters including anti-aliasing
            const bool bevel = (dx1 * dx2 + dy1 * dy2) > 1e-5f;
            if (ImFabs(miter_l_recip) > 1e-5f)
            {
                float miter_l = half_thickness / miter_l_recip;
                // Limit (inner) miter so it doesn't shoot away when miter is longer than adjacent line segments on acute angles
                if (bevel)
                {
                    // This is too aggressive (not exactly precise)
                    float min_sqlen = sqlen1 > sqlen2 ? sqlen2 : sqlen1;
                    float miter_sqlen = ((dx1 + dx2) * (dx1 + dx2) + (dy1 + dy2) * (dy1 + dy2)) * miter_l * miter_l;
                    if (miter_sqlen > min_sqlen)
                        miter_l *= ImSqrt(min_sqlen / miter_sqlen);
                }
                mlx = p1.x - (dx1 + dx2) * miter_l;
                mly = p1.y - (dy1 + dy2) * miter_l;
                mrx = p1.x + (dx1 + dx2) * miter_l;
                mry = p1.y + (dy1 + dy2) * miter_l;
                if (antialias)
                {
                    float miter_al = half_thickness_aa / miter_l_recip;
                    mlax = p1.x - (dx1 + dx2) * miter_al;
                    mlay = p1.y - (dy1 + dy2) * miter_al;
                    mrax = p1.x + (dx1 + dx2) * miter_al;
                    mray = p1.y + (dy1 + dy2) * miter_al;
                }
            }
            else
            {
                // Avoid degeneracy for (nearly) straight lines
                mlx = p1.x + dy1 * half_thickness;
                mly = p1.y - dx1 * half_thickness;
                mrx = p1.x - dy1 * half_thickness;
                mry = p1.y + dx1 * half_thickness;
                if (antialias)
                {
                    mlax = p1.x + dy1 * half_thickness_aa;
                    mlay = p1.y - dx1 * half_thickness_aa;
                    mrax = p1.x - dy1 * half_thickness_aa;
                    mray = p1.y + dx1 * half_thickness_aa;
                }
            }
            // The two bevel vertices if the angle is right or obtuse
            // miter_sign == 1, iff the outer (maybe bevelled) edge is on the right, -1 iff it is on the left
            int miter_sign = (miter_l_recip >= 0) - (miter_l_recip < 0);
            float b1x, b1y, b2x, b2y;     // First and second bevel point
            float b1ax, b1ay, b2ax, b2ay; // First and second bevel point including anti-aliasing
            if (bevel)
            {
                // FIXME-OPT: benchmark if doing these computations only once in AA case saves cycles
                b1x = p1.x + (dx1 - dy1 * miter_sign) * half_thickness;
                b1y = p1.y + (dy1 + dx1 * miter_sign) * half_thickness;
                b2x = p1.x + (dx2 + dy2 * miter_sign) * half_thickness;
                b2y = p1.y + (dy2 - dx2 * miter_sign) * half_thickness;
                if (antialias)
                {
                    b1ax = p1.x + (dx1 - dy1 * miter_sign) * half_thickness_aa;
                    b1ay = p1.y + (dy1 + dx1 * miter_sign) * half_thickness_aa;
                    b2ax = p1.x + (dx2 + dy2 * miter_sign) * half_thickness_aa;
                    b2ay = p1.y + (dy2 - dx2 * miter_sign) * half_thickness_aa;
                }
            }

            // Set the previous line direction so it doesn't need to be recomputed
            dx1 = -dx2;
            dy1 = -dy2;
            sqlen1 = sqlen2;

            // Now that we have all the point coordinates, put them into buffers

            // Vertices for each point are ordered in vertex buffer like this (looking in the direction of the polyline):
            // - left vertex*
            // - right vertex*
            // - left vertex AA fringe*  (if antialias)
            // - right vertex AA fringe* (if antialias)
            // - the remaining vertex (if bevel)
            // - the remaining vertex AA fringe (if bevel and antialias)
            // (*) if there is bevel, these vertices are the ones on the incoming edge.
            // Having all the vertices of the incoming edge in predictable positions is important - we reference them
            // even if we don't know relevant line properties yet

            int vertex_count = antialias ? (bevel ? 6 : 4) : (bevel ? 3 : 2); // FIXME: shorten the expression
            unsigned int bi = antialias ? 4 : 2; // Outgoing edge bevel vertex index
            const bool bevel_l = bevel && miter_sign < 0;
            const bool bevel_r = bevel && miter_sign > 0;

            _VtxWritePtr[0].pos.x = bevel_l ? b1x : mlx; _VtxWritePtr[0].pos.y = bevel_l ? b1y : mly; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = bevel_r ? b1x : mrx; _VtxWritePtr[1].pos.y = bevel_r ? b1y : mry; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            if (bevel)
            {
                _VtxWritePtr[bi].pos.x = b2x; _VtxWritePtr[bi].pos.y = b2y; _VtxWritePtr[bi].uv = uv; _VtxWritePtr[bi].col = col;
            }

            if (antialias)
            {
                _VtxWritePtr[2].pos.x = bevel_l ? b1ax : mlax; _VtxWritePtr[2].pos.y = bevel_l ? b1ay : mlay; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr[3].pos.x = bevel_r ? b1ax : mrax; _VtxWritePtr[3].pos.y = bevel_r ? b1ay : mray; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                if (bevel)
                {
                    _VtxWritePtr[5].pos.x = b2ax; _VtxWritePtr[5].pos.y = b2ay; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
                }
            }
            unused_vertices += max_n_vtx - vertex_count;
            _VtxWritePtr += vertex_count;

            if (i1 < count)
            {
                const int vtx_next_id = i1 < points_count-1 ? _VtxCurrentIdx+vertex_count : first_vtx_ptr;
                unsigned int l1i = _VtxCurrentIdx + (bevel_l ? bi : 0);
                unsigned int r1i = _VtxCurrentIdx + (bevel_r ? bi : 1);
                unsigned int l2i = vtx_next_id;
                unsigned int r2i = vtx_next_id + 1;
                unsigned int ebi = _VtxCurrentIdx + (bevel_l ? 0 : 1); // incoming edge bevel vertex index

                _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)r2i;
                _IdxWritePtr[3] = (ImDrawIdx)l1i; _IdxWritePtr[4] = (ImDrawIdx)r2i; _IdxWritePtr[5] = (ImDrawIdx)l2i;
                _IdxWritePtr += 6;

                if (bevel)
                {
                    _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)ebi;
                    _IdxWritePtr += 3;
                }
                else
                    unused_indices += 3;

                if (antialias)
                {
                    unsigned int l1ai = _VtxCurrentIdx + (bevel_l ? 5 : 2);
                    unsigned int r1ai = _VtxCurrentIdx + (bevel_r ? 5 : 3);
                    unsigned int l2ai = vtx_next_id + 2;
                    unsigned int r2ai = vtx_next_id + 3;

                    _IdxWritePtr[0] = (ImDrawIdx)l1ai; _IdxWritePtr[1]  = (ImDrawIdx)l1i; _IdxWritePtr[2]  = (ImDrawIdx)l2i;
                    _IdxWritePtr[3] = (ImDrawIdx)l1ai; _IdxWritePtr[4]  = (ImDrawIdx)l2i; _IdxWritePtr[5]  = (ImDrawIdx)l2ai;
                    _IdxWritePtr[6] = (ImDrawIdx)r1ai; _IdxWritePtr[7]  = (ImDrawIdx)r1i; _IdxWritePtr[8]  = (ImDrawIdx)r2i;
                    _IdxWritePtr[9] = (ImDrawIdx)r1ai; _IdxWritePtr[10] = (ImDrawIdx)r2i; _IdxWritePtr[11] = (ImDrawIdx)r2ai;
                    _IdxWritePtr += 12;

                    if (bevel)
                    {
                        _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 3 : 0));
                        _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));

                        _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));
                        _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 4 : 5));
                        _IdxWritePtr += 6;
                    }
                    else
                    {
                        unused_indices += 6;
                    }
                }
            }
            _VtxCurrentIdx += vertex_count;
        }
        PrimUnreserve((int)unused_indices, (int)unused_vertices);
    }
}